

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

ImfHeader * ImfNewHeader(void)

{
  ImfHeader *pIVar1;
  exception *e;
  Compression in_stack_0000001c;
  LineOrder in_stack_00000020;
  float in_stack_00000024;
  V2f *in_stack_00000028;
  float in_stack_00000034;
  int in_stack_00000038;
  int in_stack_0000003c;
  Header *in_stack_00000040;
  Vec2<float> local_1c [3];
  
  pIVar1 = (ImfHeader *)operator_new(0x38);
  Imath_3_2::Vec2<float>::Vec2(local_1c,0.0,0.0);
  Imf_3_4::Header::Header
            (in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000034,
             in_stack_00000028,in_stack_00000024,in_stack_00000020,in_stack_0000001c);
  return pIVar1;
}

Assistant:

ImfHeader*
ImfNewHeader (void)
{
    try
    {
        return (ImfHeader*) new OPENEXR_IMF_INTERNAL_NAMESPACE::Header;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}